

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

Vector3 * __thiscall iDynTree::KinDynComputations::getCenterOfMassVelocity(KinDynComputations *this)

{
  SpatialInertia *scalar;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *other;
  KinDynComputations *in_RDI;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *this_00;
  double total_mass;
  SpatialMomentum m_totalMomentum_in_com_inertial;
  Position com_in_inertial;
  KinDynComputationsPrivateAttributes *in_stack_fffffffffffffe40;
  KinDynComputations *pKVar1;
  VectorFixSize<3U> *vec;
  KinDynComputations *in_stack_fffffffffffffe68;
  Position *this_01;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe88;
  Position local_118 [24];
  Rotation local_100 [72];
  Transform local_b8 [96];
  Transform local_58 [8];
  SpatialVector<iDynTree::SpatialForceVector> local_50;
  VectorFixSize<3U> local_20;
  
  pKVar1 = in_RDI;
  computeRawMassMatrixAndTotalMomentum(in_RDI);
  vec = &local_20;
  getCenterOfMassPosition(in_stack_fffffffffffffe68);
  iDynTree::Rotation::Identity();
  this_01 = local_118;
  iDynTree::Position::operator-(this_01);
  iDynTree::Transform::Transform(local_b8,local_100,this_01);
  iDynTree::Transform::operator*(local_58,(SpatialMomentum *)local_b8);
  scalar = KinDynComputationsPrivateAttributes::getRobotLockedInertia(in_stack_fffffffffffffe40);
  this_00 = (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
            iDynTree::SpatialInertia::getMass();
  VectorFixSize<3U>::VectorFixSize((VectorFixSize<3U> *)in_RDI);
  other = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
           *)SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3(&local_50);
  toEigen<3U>(vec);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator/
            (in_stack_fffffffffffffe88,(double *)scalar);
  toEigen<3U>(vec);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=(this_00,other);
  SpatialMomentum::~SpatialMomentum((SpatialMomentum *)0x1cd2f6);
  return (Vector3 *)pKVar1;
}

Assistant:

Vector3 KinDynComputations::getCenterOfMassVelocity()
{
    this->computeRawMassMatrixAndTotalMomentum();

    // We exploit the structure of the cached total momentum to the the com velocity
    Position com_in_inertial = this->getCenterOfMassPosition();

    // Express the total momentum with the orientation of the inertial frame but in the center of mass
    SpatialMomentum m_totalMomentum_in_com_inertial = Transform(Rotation::Identity(),-com_in_inertial)*this->pimpl->m_totalMomentum;

    // The com velocity is just the linear part divided by the total mass
    double total_mass = pimpl->getRobotLockedInertia().getMass();

    Vector3 com_vel;
    toEigen(com_vel) = toEigen(m_totalMomentum_in_com_inertial.getLinearVec3())/total_mass;

    return com_vel;
}